

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
 __thiscall ninx::parser::Parser::parse_function_call_argument(Parser *this)

{
  string *this_00;
  undefined1 auVar1 [8];
  _Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  __ptr;
  int iVar2;
  pointer __p;
  Token *pTVar3;
  FunctionCallArgument *this_01;
  ParserException *pPVar4;
  string *in_RSI;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  id_ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  id;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  value;
  undefined1 local_60 [8];
  _Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  local_58;
  undefined1 local_50 [8];
  string local_48;
  
  local_58.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
       (_Head_base<0UL,_ninx::parser::element::Expression_*,_false>)(Expression *)0x0;
  this_00 = in_RSI + 1;
  iVar2 = TokenReader::check_limiter((TokenReader *)this_00,'{');
  if (iVar2 == 0) {
    pTVar3 = TokenReader::peek_token((TokenReader *)this_00);
    iVar2 = (*pTVar3->_vptr_Token[2])(pTVar3);
    if (iVar2 != 3) {
      pTVar3 = TokenReader::get_token((TokenReader *)this_00);
      iVar2 = (*pTVar3->_vptr_Token[2])(pTVar3);
      if (iVar2 != 0) {
        pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "Invalid function argument name. It must be alphanumeric, and begin with a letter."
                   ,"");
        exception::ParserException::ParserException(pPVar4,pTVar3,in_RSI,&local_48);
        __cxa_throw(pPVar4,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error)
        ;
      }
      __dynamic_cast(pTVar3,&lexer::token::Token::typeinfo,&lexer::token::Text::typeinfo,0);
      lexer::token::Text::get_identifier_abi_cxx11_((Text *)local_60);
      __ptr.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
           (_Head_base<0UL,_ninx::parser::element::Expression_*,_false>)
           (_Head_base<0UL,_ninx::parser::element::Expression_*,_false>)local_58;
      auVar1 = local_60;
      if ((tuple<ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
           )local_60 == (_Head_base<0UL,_ninx::parser::element::Expression_*,_false>)0x0) {
        pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "Invalid function argument name. It must be alphanumeric, and begin with a letter."
                   ,"");
        exception::ParserException::ParserException(pPVar4,pTVar3,in_RSI,&local_48);
        __cxa_throw(pPVar4,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error)
        ;
      }
      local_60 = (undefined1  [8])0x0;
      local_58.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
           (_Head_base<0UL,_ninx::parser::element::Expression_*,_false>)
           (_Head_base<0UL,_ninx::parser::element::Expression_*,_false>)auVar1;
      if (__ptr.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl !=
          (Expression *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>.
                     _M_head_impl);
      }
      iVar2 = TokenReader::check_limiter((TokenReader *)this_00,'=');
      if (iVar2 != 1) {
        pTVar3 = TokenReader::get_token((TokenReader *)this_00);
        pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Expected \'=\' after argument name, but could not find one."
                   ,"");
        exception::ParserException::ParserException(pPVar4,pTVar3,in_RSI,&local_48);
        __cxa_throw(pPVar4,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error)
        ;
      }
      TokenReader::get_token((TokenReader *)this_00);
      if (local_60 != (undefined1  [8])0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      }
    }
  }
  parse_level_3_expression((Parser *)local_50);
  this_01 = (FunctionCallArgument *)operator_new(0x28);
  local_48._M_dataplus._M_p =
       (pointer)local_58.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>.
                _M_head_impl;
  local_58.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
       (_Head_base<0UL,_ninx::parser::element::Expression_*,_false>)(Expression *)0x0;
  local_60 = local_50;
  local_50 = (undefined1  [8])0x0;
  element::FunctionCallArgument::FunctionCallArgument
            (this_01,(unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,
             (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
              *)local_60);
  (this->origin)._M_dataplus._M_p = (pointer)this_01;
  if ((_Head_base<0UL,_ninx::parser::element::Expression_*,_false>)local_60 !=
      (_Head_base<0UL,_ninx::parser::element::Expression_*,_false>)0x0) {
    (*(((Statement *)local_60)->super_ASTElement)._vptr_ASTElement[1])();
  }
  local_60 = (undefined1  [8])0x0;
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_48._M_dataplus._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_48._M_dataplus._M_p);
  }
  if (local_58.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl !=
      (Expression *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_58.super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>.
                 _M_head_impl);
  }
  return (__uniq_ptr_data<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FunctionCallArgument> ninx::parser::Parser::parse_function_call_argument() {
    // Check if the function call argument use implicit naming ( without the argument name )
    // to do that, check if there is the beginning of a block.

    std::unique_ptr<std::string> id{nullptr}; // Argument name

    if (reader.check_limiter('{') == 0 && reader.peek_token()->get_type() != Type::VARIABLE) {
        auto raw_token{reader.get_token()};

        if (raw_token->get_type() != Type::TEXT) {
            throw ParserException(raw_token, this->origin,
                                  "Invalid function argument name. It must be alphanumeric, and begin with a letter.");
        }
        auto id_ptr{dynamic_cast<ninx::lexer::token::Text *>(raw_token)->get_identifier()};
        if (!id_ptr) {
            throw ParserException(raw_token, this->origin,
                                  "Invalid function argument name. It must be alphanumeric, and begin with a letter.");
        }
        id = std::move(id_ptr);

        if (reader.check_limiter('=') != 1) {
            auto error_token{reader.get_token()};
            throw ParserException(error_token, this->origin,
                                  "Expected '=' after argument name, but could not find one.");
        }
        reader.get_token();  // Skip the = limiter
    }

    auto value{parse_expression()};

    auto argument = std::make_unique<FunctionCallArgument>(std::move(id), std::move(value));

    return argument;
}